

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O2

int check_boms(void)

{
  uint uVar1;
  uchar *input;
  long lVar2;
  int iVar3;
  char *pcVar4;
  yaml_char_t *pyVar5;
  char *__format;
  size_t size;
  long lVar6;
  uint local_214;
  yaml_parser_t parser;
  
  puts("checking boms...");
  lVar6 = 0;
  local_214 = 0;
  do {
    input = (uchar *)boms[lVar6].test;
    if (input == (uchar *)0x0) {
      printf("checking boms: %d fail(s)\n",(ulong)local_214);
      return local_214;
    }
    uVar1 = boms[lVar6].result;
    size = 0xffffffffffffffff;
    do {
      lVar2 = size + 1;
      size = size + 1;
    } while (input[lVar2] != '!');
    printf("\t%s: ",boms[lVar6].title);
    yaml_parser_initialize(&parser);
    yaml_parser_set_input_string(&parser,input,size);
    iVar3 = yaml_parser_update_buffer(&parser,size);
    pyVar5 = parser.buffer.start;
    pcVar4 = bom_original;
    if (iVar3 == 0) {
      __format = "- (reader error: %s at %ld)\n";
      pcVar4 = (char *)parser.problem_offset;
      pyVar5 = (yaml_char_t *)parser.problem;
LAB_00102473:
      printf(__format,pyVar5,pcVar4);
LAB_0010248f:
      local_214 = local_214 + 1;
    }
    else {
      if (parser.unread != (long)(int)uVar1) {
        printf("- (length=%ld while expected length=%d)\n",parser.unread,(ulong)uVar1);
        goto LAB_0010248f;
      }
      iVar3 = bcmp(parser.buffer.start,bom_original,parser.unread);
      if (iVar3 != 0) {
        __format = "- (value \'%s\' does not equal to the original value \'%s\')\n";
        goto LAB_00102473;
      }
      puts("+");
    }
    yaml_parser_delete(&parser);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

int check_boms(void)
{
    yaml_parser_t parser;
    int failed = 0;
    int k;
    printf("checking boms...\n");
    for (k = 0; boms[k].test; k++) {
        char *title = boms[k].title;
        int check = boms[k].result;
        int result;
        char *start = boms[k].test;
        char *end = start;
        while (*end != '!') end++;
        printf("\t%s: ", title);
        yaml_parser_initialize(&parser);
        yaml_parser_set_input_string(&parser, (unsigned char *)start, end-start);
        result = yaml_parser_update_buffer(&parser, end-start);
        if (!result) {
            printf("- (reader error: %s at %ld)\n", parser.problem, (long)parser.problem_offset);
            failed++;
        }
        else {
            if (parser.unread != check) {
                printf("- (length=%ld while expected length=%d)\n", (long)parser.unread, check);
                failed++;
            }
            else if (memcmp(parser.buffer.start, bom_original, check) != 0) {
                printf("- (value '%s' does not equal to the original value '%s')\n", parser.buffer.start, bom_original);
                failed++;
            }
            else {
                printf("+\n");
            }
        }
        yaml_parser_delete(&parser);
    }
    printf("checking boms: %d fail(s)\n", failed);
    return failed;
}